

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_node_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  apx_nodeInstance_t *paVar5;
  undefined1 local_140 [8];
  sigset_t oldmask;
  sigset_t mask;
  apx_portCount_t num_require_ports;
  apx_portCount_t num_provide_ports;
  apx_nodeInstance_t *node_instance;
  int32_t errorLine;
  apx_error_t rc;
  uint16_t dummy_port_1;
  uint16_t dummy_port;
  argparse_result_t result;
  int retval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  m_bind_port = 0x13ec;
  m_connect_port = 5000;
  _result = argv;
  argv_local._0_4_ = argc;
  adt_str_create(&m_definition_file);
  _dummy_port_1 = 0;
  rc = argparse_exec((int)argv_local,_result,argparse_cbk);
  if (rc == 0) {
    if ((m_bind_resource_type == '\0') &&
       ((m_bind_resource_type =
              apx_parse_resource_name(m_bind_address_default,&m_bind_address,(long)&errorLine + 2),
        m_bind_resource_type == '\0' || (m_bind_resource_type == '\x05')))) {
      __assert_fail("(m_bind_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_bind_resource_type != APX_RESOURCE_TYPE_ERROR)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/apx_node_main.c"
                    ,0x89,"int main(int, char **)");
    }
    if ((m_connect_resource_type == '\0') &&
       ((m_connect_resource_type =
              apx_parse_resource_name(m_connect_address_default,&m_connect_address,&errorLine),
        m_connect_resource_type == '\0' || (m_connect_resource_type == '\x05')))) {
      __assert_fail("(m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/apx_node_main.c"
                    ,0x90,"int main(int, char **)");
    }
    if ((m_display_version & 1U) != 0) {
      print_version();
    }
    if ((m_display_help & 1U) != 0) {
      print_usage(*_result);
    }
    iVar1 = adt_str_length(&m_definition_file);
    if (iVar1 == 0) {
      if (((m_display_version & 1U) == 0) && ((m_display_help & 1U) == 0)) {
        printf("Error: No definition file given\n");
        print_usage(*_result);
      }
    }
    else {
      printf("Initializing APX connection...");
      m_apx_connection = apx_connection_new();
      if (m_apx_connection == (apx_connection_t *)0x0) {
        printf("Failed\n");
        _dummy_port_1 = 1;
      }
      else {
        printf("OK\n");
        m_apx_definition_str = read_definition_file(&m_definition_file);
        __stream = _stderr;
        if (m_apx_definition_str == (adt_str_t *)0x0) {
          uVar4 = adt_str_cstr(&m_definition_file);
          fprintf(__stream,"Error: Could not read file \'%s\'\n",uVar4);
          _dummy_port_1 = 1;
        }
        else {
          uVar4 = adt_str_cstr(&m_definition_file);
          uVar2 = adt_str_size(m_apx_definition_str);
          printf("Parsing %s (%d bytes)...",uVar4,(ulong)uVar2);
          uVar2 = apx_connection_attachNode(m_apx_connection,m_apx_definition_str);
          if (uVar2 != 0) {
            if (uVar2 == 3) {
              uVar2 = apx_connection_getLastErrorLine(m_apx_connection);
              printf("Failed\n");
              fprintf(_stderr,"Error: Parse error on line %d\n",(ulong)uVar2);
            }
            else {
              printf("Failed\n");
              fprintf(_stderr,"Error: attach node failed with error code %d\n",(ulong)uVar2);
            }
            return 1;
          }
          printf("OK\n");
          paVar5 = apx_connection_getLastAttachedNode(m_apx_connection);
          if (paVar5 != (apx_nodeInstance_t *)0x0) {
            uVar2 = apx_nodeInstance_get_num_provide_ports(paVar5);
            uVar3 = apx_nodeInstance_get_num_require_ports(paVar5);
            uVar4 = apx_nodeInstance_get_name(paVar5);
            printf("\t%s: Provide-Ports: %d, Require-Ports: %d\n",uVar4,(ulong)uVar2,(ulong)uVar3);
          }
          uVar4 = adt_str_cstr(m_connect_address);
          printf("Connecting to APX server at %s...",uVar4);
          uVar2 = connect_to_apx_server();
          if (uVar2 == 0) {
            printf("OK\n");
            if ((m_no_bind & 1U) == 0) {
              printf("Initializing JSON message server...");
              uVar2 = init_json_message_server();
              if (uVar2 != 0) {
                printf("Failed (%d)\n",(ulong)uVar2);
                goto LAB_001030e0;
              }
              printf("OK\n");
              uVar4 = adt_str_cstr(m_bind_address);
              printf("Starting JSON message server at \"%s\"...",uVar4);
              uVar2 = start_json_message_server();
              if (uVar2 != 0) {
                printf("Failed (%d)\n",(ulong)uVar2);
                goto LAB_001030e0;
              }
              printf("OK\n");
              m_messageServerRunning = true;
            }
            signal_handler_setup();
            sigemptyset((sigset_t *)(oldmask.__val + 0xf));
            sigaddset((sigset_t *)(oldmask.__val + 0xf),2);
            sigaddset((sigset_t *)(oldmask.__val + 0xf),0xf);
            sigprocmask(0,(sigset_t *)(oldmask.__val + 0xf),(sigset_t *)local_140);
            while (m_runFlag != 0) {
              sigsuspend((sigset_t *)local_140);
            }
            sigprocmask(1,(sigset_t *)(oldmask.__val + 0xf),(sigset_t *)0x0);
          }
          else {
            printf("Failed (%d)\n",(ulong)uVar2);
          }
        }
      }
    }
  }
  else {
    printf("Error parsing argument (%d)\n",(ulong)(uint)rc);
    print_usage(*_result);
  }
LAB_001030e0:
  application_shutdown();
  application_cleanup();
  return _dummy_port_1;
}

Assistant:

int main(int argc, char **argv)
{
   m_bind_port = bind_port_default;
   m_connect_port = connect_port_default;
   adt_str_create(&m_definition_file);
   int retval = 0;
   argparse_result_t result = argparse_exec(argc, (const char**) argv, argparse_cbk);
   if (result == ARGPARSE_SUCCESS)
   {
#ifdef _WIN32
      if (init_wsa() != 0)
      {
         int err = WSAGetLastError();
         fprintf(stderr, "WSAStartup failed with error: %d\n", err);
         retval = 1;
         goto SHUTDOWN;
      }
#endif
      if (m_bind_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
      {
         uint16_t dummy_port;
         m_bind_resource_type = apx_parse_resource_name(m_bind_address_default, &m_bind_address, &dummy_port);
         (void) dummy_port;
         assert( (m_bind_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_bind_resource_type != APX_RESOURCE_TYPE_ERROR) );
      }
      if (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
      {
         uint16_t dummy_port;
         m_connect_resource_type = apx_parse_resource_name(m_connect_address_default, &m_connect_address, &dummy_port);
         (void) dummy_port;
         assert( (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) );
      }
      if (m_display_version)
      {
         print_version();
      }
      if (m_display_help)
      {
         print_usage(argv[0]);
      }
      if (adt_str_length(&m_definition_file) == 0)
      {
         if (!m_display_version && !m_display_help)
         {
            printf("Error: No definition file given\n");
            print_usage(argv[0]);
         }
      }
      else
      {
         printf("Initializing APX connection...");
         m_apx_connection = apx_connection_new();
         if (m_apx_connection != 0)
         {
            printf("OK\n");
         }
         else
         {
            printf("Failed\n");
            retval = 1;
            goto SHUTDOWN;
         }
         m_apx_definition_str = read_definition_file(&m_definition_file);
         if (m_apx_definition_str != 0)
         {
            printf("Parsing %s (%d bytes)...", adt_str_cstr(&m_definition_file), adt_str_size(m_apx_definition_str));
            apx_error_t rc = apx_connection_attachNode(m_apx_connection, m_apx_definition_str);
            if (rc != APX_NO_ERROR)
            {
               if (rc == APX_PARSE_ERROR)
               {
                  int32_t errorLine = apx_connection_getLastErrorLine(m_apx_connection);
                  printf("Failed\n");
                  fprintf(stderr, "Error: Parse error on line %d\n", (int) errorLine);
               }
               else
               {
                  printf("Failed\n");
                  fprintf(stderr, "Error: attach node failed with error code %d\n", (int) rc);
               }
               return 1;
            }
            else
            {
               apx_nodeInstance_t *node_instance;
               apx_portCount_t num_provide_ports;
               apx_portCount_t num_require_ports;
               printf("OK\n");
               node_instance = apx_connection_getLastAttachedNode(m_apx_connection);
               if (node_instance != 0)
               {
                  num_provide_ports = apx_nodeInstance_get_num_provide_ports(node_instance);
                  num_require_ports = apx_nodeInstance_get_num_require_ports(node_instance);
                  printf("\t%s: Provide-Ports: %d, Require-Ports: %d\n",
                        apx_nodeInstance_get_name(node_instance),
                        (int) num_provide_ports, (int) num_require_ports);
               }
               printf("Connecting to APX server at %s...", adt_str_cstr(m_connect_address));
               rc = connect_to_apx_server();
               if (rc == APX_NO_ERROR)
               {
#ifndef _WIN32
                  sigset_t mask, oldmask;
#endif
                  printf("OK\n");
                  if (!m_no_bind)
                  {                     
                     printf("Initializing JSON message server...");
                     rc = init_json_message_server();
                     if (rc == APX_NO_ERROR)
                     {
                        printf("OK\n");
                     }
                     else
                     {
                        printf("Failed (%d)\n", (int) rc);
                        goto SHUTDOWN;
                     }
                     printf("Starting JSON message server at \"%s\"...", adt_str_cstr(m_bind_address));
                     rc = start_json_message_server();
                     if (rc == APX_NO_ERROR)
                     {
                        printf("OK\n");
                        m_messageServerRunning = true;
                     }
                     else
                     {
                        printf("Failed (%d)\n", (int) rc);
                        goto SHUTDOWN;
                     }
                  }
#ifdef _WIN32
                  while(m_runFlag)
                  {
                     SLEEP(1);
                  }
#else
                  signal_handler_setup();
                  sigemptyset(&mask);
                  sigaddset(&mask, SIGINT);
                  sigaddset(&mask, SIGTERM);
                  sigprocmask(SIG_BLOCK, &mask, &oldmask);
                  while(m_runFlag)
                  {
                     sigsuspend(&oldmask);
                  }
                  sigprocmask(SIG_UNBLOCK, &mask, NULL);
#endif
               }
               else
               {
                  printf("Failed (%d)\n", (int) rc);
               }
            }
         }
         else
         {
            fprintf(stderr, "Error: Could not read file '%s'\n", adt_str_cstr(&m_definition_file));
            retval = 1;
            goto SHUTDOWN;
         }
      }
   }
   else
   {
      printf("Error parsing argument (%d)\n", (int) result);
      print_usage(argv[0]);
   }
SHUTDOWN:
   application_shutdown();
   application_cleanup();
   return retval;
}